

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_setupvalt(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  ushort uVar1;
  UpVal *pUVar2;
  Value *pVVar3;
  
  if (ra->tt_ != 0x8005) {
    luaG_runerror(L,"upvalue of table type, cannot be set to non table value");
  }
  pUVar2 = cl->upvals[b];
  pVVar3 = &pUVar2->v->value_;
  *pVVar3 = ra->value_;
  uVar1 = ra->tt_;
  *(ushort *)(pVVar3 + 1) = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pVVar3->gc->tt ||
      ((L != (lua_State *)0x0 && ((pVVar3->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xbd1,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
  }
  if (((short)ra->tt_ < 0) && (pUVar2->v == (TValue *)&pUVar2->u)) {
    luaC_upvalbarrier_(L,(ra->value_).gc);
    return;
  }
  return;
}

Assistant:

void raviV_op_setupvalt(lua_State *L, LClosure *cl, TValue *ra, int b) {
  if (!ttisLtable(ra))
    luaG_runerror(L, "upvalue of table type, cannot be set to non table value");
  UpVal *uv = cl->upvals[b];
  setobj(L, uv->v, ra);
  luaC_upvalbarrier(L, uv, ra);
}